

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O1

void __thiscall
xemmai::t_define<xemmai::t_os>::f_derive<std::filesystem::file_type,long>
          (t_define<xemmai::t_os> *this)

{
  t_slot *ptVar1;
  t_object *ptVar2;
  t_os *ptVar3;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  long *plVar4;
  t_object *ptVar5;
  undefined8 *puVar6;
  
  ptVar3 = this->v_library;
  plVar4 = (long *)__tls_get_addr(&PTR_0011ee38);
  ptVar5 = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<std::filesystem::file_type>>
                     (*(t_type_of<xemmai::t_object> **)(*plVar4 + 0x178),
                      (t_object *)&ptVar3[-1].v_type_file_type.v_slot,&this->v_fields);
  (ptVar3->v_type_file_type).v_p = (t_type_of<xemmai::t_object> *)ptVar5->v_data;
  if ((t_object *)0x4 < ptVar5) {
    puVar6 = (undefined8 *)__tls_get_addr(&PTR_0011ece0);
    this_00 = (t_queue<128UL> *)*puVar6;
    *this_00->v_head = ptVar5;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = &(ptVar3->v_type_file_type).v_slot;
  ptVar2 = (ptVar1->v_p)._M_b._M_p;
  (ptVar1->v_p)._M_b._M_p = ptVar5;
  UNLOCK();
  if ((t_object *)0x4 < ptVar2) {
    puVar6 = (undefined8 *)__tls_get_addr(&PTR_0011ed30);
    this_01 = (t_queue<256UL> *)*puVar6;
    *this_01->v_head = ptVar2;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
      return;
    }
    this_01->v_head = this_01->v_head + 1;
  }
  return;
}

Assistant:

void f_derive()
	{
		v_library->template f_type_slot<T>().f_construct(v_library->template f_type<T_super>()->template f_derive<t_type_of<T>>(t_object::f_of(v_library), v_fields));
	}